

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_tuning(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  av1_extracfg *in_RSI;
  aom_codec_alg_priv_t_conflict *in_RDI;
  aom_codec_err_t err;
  av1_extracfg extra_cfg;
  aom_tune_metric *local_288;
  uint uVar1;
  av1_extracfg local_270;
  av1_extracfg *local_18;
  aom_codec_alg_priv_t_conflict *local_10;
  aom_codec_err_t local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(&local_270,&in_RDI->extra_cfg,600);
  uVar1 = local_18->cpu_used;
  if (uVar1 < 0x29) {
    local_288 = (aom_tune_metric *)((long)(int)uVar1 + *(long *)&local_18->sharpness);
    local_18->cpu_used = uVar1 + 8;
  }
  else {
    local_288 = *(aom_tune_metric **)&local_18->enable_auto_bwd_ref;
    *(aom_tune_metric **)&local_18->enable_auto_bwd_ref = local_288 + 2;
  }
  local_270.tuning = *local_288;
  local_4 = handle_tuning(local_10,&local_270);
  if (local_4 == AOM_CODEC_OK) {
    local_4 = update_extra_cfg((aom_codec_alg_priv_t_conflict *)(ulong)uVar1,local_18);
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_tuning(aom_codec_alg_priv_t *ctx,
                                       va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.tuning = CAST(AOME_SET_TUNING, args);
  aom_codec_err_t err = handle_tuning(ctx, &extra_cfg);
  if (err != AOM_CODEC_OK) return err;
  return update_extra_cfg(ctx, &extra_cfg);
}